

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.cpp
# Opt level: O2

ostream * operator<<(ostream *os,Token *token)

{
  char *pcVar1;
  string local_30;
  
  switch(token->mType) {
  case NUMBER:
    NumericConstant::toString_abi_cxx11_(&local_30,&token->mNumericValue);
    std::operator<<(os,(string *)&local_30);
    goto LAB_001307db;
  case OPERATOR:
    std::operator<<(os,token->mCharValue);
    return os;
  default:
    goto switchD_0013079f_caseD_2;
  case IDENTIFIER:
    std::__cxx11::string::string((string *)&local_30,(string *)&token->mIdentifier);
    std::operator<<(os,(string *)&local_30);
LAB_001307db:
    std::__cxx11::string::~string((string *)&local_30);
    return os;
  case LEFT_PARENTHESIS:
    pcVar1 = "(";
    break;
  case RIGHT_PARENTHESIS:
    pcVar1 = ")";
    break;
  case COMMA:
    pcVar1 = ",";
  }
  std::operator<<(os,pcVar1);
switchD_0013079f_caseD_2:
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const Token& token) {
	switch (token.type()) {
		case TokenType::NUMBER:
			os << token.numericValue().toString();
			break;
		case TokenType::OPERATOR:
			os << token.charValue();
			break;
		case TokenType::IDENTIFIER:
			os << token.identifier();
			break;
		case TokenType::LEFT_PARENTHESIS:
			os << "(";
			break;
		case TokenType::RIGHT_PARENTHESIS:
			os << ")";
			break;
		case TokenType::COMMA:
			os << ",";
			break;
		default:
			break;
	}

	return os;
}